

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message ** __thiscall
google::protobuf::Reflection::MutableField<google::protobuf::Message*>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  Message **ppMVar2;
  
  pOVar1 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar1 == (OneofDescriptor *)0x0) {
    SetHasBit(this,message,field);
  }
  else {
    SetOneofCase(this,message,field);
  }
  ppMVar2 = MutableRaw<google::protobuf::Message*>(this,message,field);
  return ppMVar2;
}

Assistant:

Type* Reflection::MutableField(Message* message,
                               const FieldDescriptor* field) const {
  schema_.InRealOneof(field) ? SetOneofCase(message, field)
                             : SetHasBit(message, field);
  return MutableRaw<Type>(message, field);
}